

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::addMemberDecoration(Builder *this,Id id,uint member,Decoration decoration,int num)

{
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  pointer *__ptr;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  
  this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       dxil_spv::allocate_in_thread(0x38);
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001e31e0;
  *(undefined8 *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = 0;
  *(Op *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
       OpMemberDecorate;
  (((Vector<Id> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
  *(Block **)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = (Block *)0x0;
  Instruction::addIdOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,id);
  Instruction::addImmediateOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,member);
  Instruction::addImmediateOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,decoration);
  if (-1 < num) {
    Instruction::addImmediateOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,num);
  }
  local_38._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->decorations,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Builder::addMemberDecoration(Id id, unsigned int member, Decoration decoration, int num)
{
    Instruction* dec = new Instruction(OpMemberDecorate);
    dec->addIdOperand(id);
    dec->addImmediateOperand(member);
    dec->addImmediateOperand(decoration);
    if (num >= 0)
        dec->addImmediateOperand(num);

    decorations.push_back(std::unique_ptr<Instruction>(dec));
}